

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompilerLibrary.hpp
# Opt level: O3

Version __thiscall Diligent::DXCompilerLibrary::GetVersion(DXCompilerLibrary *this)

{
  string msg;
  string local_30;
  
  if (((this->m_Loaded)._M_base._M_i & 1U) == 0) {
    FormatString<char[33]>(&local_30,(char (*) [33])"DXCompiler library is not loaded");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetVersion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/DXCompilerLibrary.hpp"
               ,0x5d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return this->m_Version;
}

Assistant:

Version GetVersion() const
    {
        VERIFY(m_Loaded.load(), "DXCompiler library is not loaded");
        return m_Version;
    }